

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaFxch.c
# Opt level: O0

int Fxch_TabSingleDivisors(Fxch_Man_t *p,int iCube,int fAdd)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int Lit2;
  int Lit;
  int k;
  int i;
  Vec_Int_t *vCube;
  int fAdd_local;
  int iCube_local;
  Fxch_Man_t *p_local;
  
  p_00 = Vec_WecEntry(&p->vCubes,iCube);
  iVar1 = Vec_IntSize(p_00);
  if (iVar1 < 2) {
    p_local._4_4_ = 0;
  }
  else {
    for (Lit = 0; iVar1 = Vec_IntSize(p_00), Lit < iVar1; Lit = Lit + 1) {
      iVar1 = Vec_IntEntry(p_00,Lit);
      Lit2 = Lit;
      while( true ) {
        Lit2 = Lit2 + 1;
        iVar2 = Vec_IntSize(p_00);
        if (iVar2 <= Lit2) break;
        iVar2 = Vec_IntEntry(p_00,Lit2);
        if (iVar2 <= iVar1) {
          __assert_fail("Lit < Lit2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                        ,0x22f,"int Fxch_TabSingleDivisors(Fxch_Man_t *, int, int)");
        }
        if (fAdd == 0) {
          Fxch_DivisorRemove(p,iVar1,iVar2,1);
          p->nPairsS = p->nPairsS + -1;
        }
        else {
          Fxch_DivisorAdd(p,iVar1,iVar2,1);
          p->nPairsS = p->nPairsS + 1;
        }
      }
    }
    iVar1 = Vec_IntSize(p_00);
    iVar2 = Vec_IntSize(p_00);
    p_local._4_4_ = (iVar1 * (iVar2 + -1)) / 2;
  }
  return p_local._4_4_;
}

Assistant:

int Fxch_TabSingleDivisors( Fxch_Man_t * p, int iCube, int fAdd )
{
    Vec_Int_t * vCube = Vec_WecEntry( &p->vCubes, iCube );
    int i, k, Lit, Lit2;
    if ( Vec_IntSize(vCube) < 2 )
        return 0;
    Vec_IntForEachEntry( vCube, Lit, i )
    Vec_IntForEachEntryStart( vCube, Lit2, k, i+1 )
    {
        assert( Lit < Lit2 );
        if ( fAdd )
            Fxch_DivisorAdd( p, Lit, Lit2, 1 ), p->nPairsS++;
        else
            Fxch_DivisorRemove( p, Lit, Lit2, 1 ), p->nPairsS--;
    }
    return Vec_IntSize(vCube) * (Vec_IntSize(vCube) - 1) / 2;
}